

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_streaming_sample.cpp
# Opt level: O3

unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true> __thiscall
duckdb::PhysicalStreamingSample::GetOperatorState
          (PhysicalStreamingSample *this,ExecutionContext *context)

{
  char cVar1;
  uint64_t seed;
  _func_int **pp_Var2;
  pointer pSVar3;
  idx_t seed_00;
  RandomEngine random;
  RandomEngine RStack_48;
  
  cVar1 = (*(code *)(context->client->config).profiler_save_location._M_dataplus._M_p)(context);
  if (cVar1 == '\0') {
    pSVar3 = unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::
             operator->((unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>
                         *)&context[5].thread);
    seed_00 = optional_idx::GetIndex(&pSVar3->seed);
    pp_Var2 = (_func_int **)operator_new(0x38);
    *pp_Var2 = (_func_int *)&PTR__StreamingSampleOperatorState_02461280;
    RandomEngine::RandomEngine((RandomEngine *)(pp_Var2 + 1),seed_00);
    (this->super_PhysicalOperator)._vptr_PhysicalOperator = pp_Var2;
  }
  else {
    RandomEngine::RandomEngine(&RStack_48,-1);
    seed = RandomEngine::NextRandomInteger64(&RStack_48);
    pp_Var2 = (_func_int **)operator_new(0x38);
    *pp_Var2 = (_func_int *)&PTR__StreamingSampleOperatorState_02461280;
    RandomEngine::RandomEngine((RandomEngine *)(pp_Var2 + 1),seed);
    (this->super_PhysicalOperator)._vptr_PhysicalOperator = pp_Var2;
    RandomEngine::~RandomEngine(&RStack_48);
  }
  return (unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>_>)
         (unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>_>)this;
}

Assistant:

unique_ptr<OperatorState> PhysicalStreamingSample::GetOperatorState(ExecutionContext &context) const {
	if (!ParallelOperator()) {
		return make_uniq<StreamingSampleOperatorState>(static_cast<int64_t>(sample_options->seed.GetIndex()));
	}
	RandomEngine random;
	return make_uniq<StreamingSampleOperatorState>(static_cast<int64_t>(random.NextRandomInteger64()));
}